

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

TAddress * GGSock::Communicator::getLocalAddress_abi_cxx11_(void)

{
  int __fd;
  int iVar1;
  char *pcVar2;
  sockaddr *psVar3;
  TAddress *in_RDI;
  undefined1 local_49;
  char buf [16];
  socklen_t addrlen;
  sockaddr local_28;
  
  __fd = socket(2,2,0);
  if (__fd == -1) {
    pcVar2 = "";
    psVar3 = &local_28;
  }
  else {
    local_28.sa_data[6] = '\0';
    local_28.sa_data[7] = '\0';
    local_28.sa_data[8] = '\0';
    local_28.sa_data[9] = '\0';
    local_28.sa_data[10] = '\0';
    local_28.sa_data[0xb] = '\0';
    local_28.sa_data[0xc] = '\0';
    local_28.sa_data[0xd] = '\0';
    local_28.sa_family = 2;
    local_28.sa_data[0] = '\0';
    local_28.sa_data[1] = '\t';
    local_28.sa_data[2] = '\x01';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\x7f';
    iVar1 = ::connect(__fd,&local_28,0x10);
    if (iVar1 == -1) {
      close(__fd);
    }
    else {
      addrlen = 0x10;
      iVar1 = getsockname(__fd,&local_28,&addrlen);
      close(__fd);
      if (iVar1 != -1) {
        pcVar2 = inet_ntop(2,local_28.sa_data + 2,buf,0x10);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = buf;
        }
        psVar3 = (sockaddr *)&local_49;
        goto LAB_0010f129;
      }
    }
    pcVar2 = "";
    psVar3 = (sockaddr *)buf;
  }
LAB_0010f129:
  std::__cxx11::string::string((string *)in_RDI,pcVar2,(allocator *)psVar3);
  return in_RDI;
}

Assistant:

TAddress Communicator::getLocalAddress() {
        int sock = socket(PF_INET, SOCK_DGRAM, 0);
        sockaddr_in loopback;

        if (sock == -1) {
            return "";
        }

        std::memset(&loopback, 0, sizeof(loopback));
        loopback.sin_family = AF_INET;
        loopback.sin_addr.s_addr = INADDR_LOOPBACK;   // using loopback ip address
        loopback.sin_port = htons(9);                 // using debug port

        if (::connect(sock, reinterpret_cast<sockaddr*>(&loopback), sizeof(loopback)) == -1) {
            close(sock);
            return "";
        }

        socklen_t addrlen = sizeof(loopback);
        if (getsockname(sock, reinterpret_cast<sockaddr*>(&loopback), &addrlen) == -1) {
            close(sock);
            return "";
        }

        close(sock);

        char buf[INET_ADDRSTRLEN];
        if (inet_ntop(AF_INET, &loopback.sin_addr, buf, INET_ADDRSTRLEN) == 0x0) {
            return "";
        }

        return buf;
    }